

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeWidgetPrivate::emitItemActivated(QTreeWidgetPrivate *this,QModelIndex *index)

{
  QObject *pQVar1;
  QAbstractItemModel *pQVar2;
  long in_FS_OFFSET;
  uint local_44;
  QAbstractItemModel *local_40;
  void *local_38;
  QAbstractItemModel **ppQStack_30;
  uint *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)
            &(this->super_QTreeViewPrivate).super_QAbstractItemViewPrivate.
             super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  local_44 = index->c;
  pQVar2 = (index->m).ptr;
  if (pQVar2 != (QAbstractItemModel *)0x0) {
    pQVar2 = (QAbstractItemModel *)index->i;
  }
  local_40 = (QAbstractItemModel *)0x0;
  if (-1 < (int)(index->r | local_44)) {
    local_40 = pQVar2;
  }
  ppQStack_30 = &local_40;
  local_28 = &local_44;
  local_38 = (void *)0x0;
  QMetaObject::activate(pQVar1,&QTreeWidget::staticMetaObject,3,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetPrivate::emitItemActivated(const QModelIndex &index)
{
    Q_Q(QTreeWidget);
    emit q->itemActivated(item(index), index.column());
}